

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O0

ParsedSchema __thiscall
capnp::SchemaParser::parseDiskFile
          (SchemaParser *this,StringPtr displayName,StringPtr diskPath,
          ArrayPtr<const_kj::StringPtr> importPath)

{
  StringPtr pathText;
  ArrayDisposer *path_00;
  bool bVar1;
  int iVar2;
  Impl *pIVar3;
  Maybe<capnp::SchemaParser::DiskFileCompat> *pMVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar5;
  StringPtr *pSVar6;
  pointer ppVar7;
  ArrayPtr<const_kj::StringPtr> *pAVar8;
  size_t end;
  Path *pPVar9;
  StringPtr *params;
  char *__arg;
  pair<const_kj::StringPtr_*,_unsigned_long> pVar10;
  ArrayPtr<const_kj::ReadableDirectory_*const> AVar11;
  ParsedSchema PVar12;
  String local_290;
  Maybe<kj::String> local_278;
  size_t local_258;
  Maybe<kj::String> *pMStack_250;
  Path local_240;
  Own<capnp::SchemaFile,_std::nullptr_t> local_228;
  ArrayPtr<const_kj::String> local_218;
  Path local_208;
  ImportDir *local_1f0;
  ImportDir *match;
  ImportDir *_match272;
  Fault local_1d0;
  Fault f;
  _Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>
  *local_1c0;
  undefined1 local_1b8 [8];
  DebugComparison<std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_&,_std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
  _kjCondition;
  iterator iter;
  StringPtr importDir;
  StringPtr *__end2;
  StringPtr *__begin2;
  ArrayPtr<const_kj::StringPtr> *__range2;
  size_t bestMatchLength;
  Maybe<capnp::SchemaParser::DiskFileCompat::ImportDir_&> matchedImportDir;
  anon_class_24_3_19d59b29 local_138;
  Mapper<kj::ArrayPtr<const_kj::StringPtr>_&> local_120;
  Array<const_kj::ReadableDirectory_*> local_118;
  mapped_type *local_100;
  mapped_type *slot;
  StringPtr *local_f0;
  undefined1 local_e8 [8];
  pair<const_kj::StringPtr_*,_unsigned_long> importPathKey;
  ArrayPtr<const_kj::ReadableDirectory_*const> translatedImportPath;
  undefined1 local_b8 [8];
  Path path;
  ReadableDirectory *baseDir;
  PathPtr cwd;
  Directory *root;
  DiskFileCompat *c;
  DiskFileCompat *_c208;
  DiskFileCompat *compat;
  undefined1 local_50 [8];
  Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> lock;
  SchemaParser *this_local;
  StringPtr diskPath_local;
  StringPtr displayName_local;
  
  diskPath_local.content.size_ = (size_t)displayName.content.ptr;
  __arg = (char *)diskPath.content.size_;
  lock.ptr = (Maybe<capnp::SchemaParser::DiskFileCompat> *)this;
  diskPath_local.content.ptr = __arg;
  pIVar3 = kj::Own<capnp::SchemaParser::Impl,_std::nullptr_t>::operator->(&this->impl);
  kj::MutexGuarded<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_>::lockExclusive
            ((MutexGuarded<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> *)local_50,
             &pIVar3->compat);
  pMVar4 = kj::Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_>::operator*
                     ((Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> *)local_50);
  _c208 = kj::_::readMaybe<capnp::SchemaParser::DiskFileCompat>(pMVar4);
  if (_c208 == (DiskFileCompat *)0x0) {
    pMVar4 = kj::Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_>::operator->
                       ((Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> *)local_50);
    _c208 = kj::Maybe<capnp::SchemaParser::DiskFileCompat>::emplace<>(pMVar4);
  }
  iVar2 = (**_c208->fs->_vptr_Filesystem)();
  cwd.parts.size_ = CONCAT44(extraout_var,iVar2);
  iVar2 = (*_c208->fs->_vptr_Filesystem[2])();
  baseDir = (ReadableDirectory *)CONCAT44(extraout_var_00,iVar2);
  path.parts.disposer = (ArrayDisposer *)cwd.parts.size_;
  pathText.content.size_ = (size_t)diskPath_local.content.ptr;
  pathText.content.ptr = diskPath.content.ptr;
  kj::PathPtr::evalNative((Path *)local_b8,(PathPtr *)&baseDir,pathText);
  kj::ArrayPtr<const_kj::ReadableDirectory_*const>::ArrayPtr
            ((ArrayPtr<const_kj::ReadableDirectory_*const> *)&importPathKey.second,(void *)0x0);
  sVar5 = kj::ArrayPtr<const_kj::StringPtr>::size(&importPath);
  if (sVar5 != 0) {
    local_f0 = kj::ArrayPtr<const_kj::StringPtr>::begin(&importPath);
    slot = (mapped_type *)kj::ArrayPtr<const_kj::StringPtr>::size(&importPath);
    pVar10 = std::make_pair<kj::StringPtr_const*,unsigned_long>(&local_f0,(unsigned_long *)&slot);
    importPathKey.first = (StringPtr *)pVar10.second;
    local_e8 = (undefined1  [8])pVar10.first;
    local_100 = std::
                map<std::pair<const_kj::StringPtr_*,_unsigned_long>,_kj::Array<const_kj::ReadableDirectory_*>,_std::less<std::pair<const_kj::StringPtr_*,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<const_kj::StringPtr_*,_unsigned_long>,_kj::Array<const_kj::ReadableDirectory_*>_>_>_>
                ::operator[](&_c208->cachedImportPaths,(key_type *)local_e8);
    bVar1 = kj::Array<const_kj::ReadableDirectory_*>::operator==(local_100,(void *)0x0);
    if (bVar1) {
      kj::_::Mapper<kj::ArrayPtr<const_kj::StringPtr>_&>::Mapper(&local_120,&importPath);
      local_138.compat = &_c208;
      local_138.cwd = (PathPtr *)&baseDir;
      local_138.root = (Directory *)cwd.parts.size_;
      kj::_::Mapper<kj::ArrayPtr<const_kj::StringPtr>_&>::
      operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_parser_c__:227:14)>
                (&local_118,&local_120,&local_138);
      kj::Array<const_kj::ReadableDirectory_*>::operator=(local_100,&local_118);
      kj::Array<const_kj::ReadableDirectory_*>::~Array(&local_118);
    }
    AVar11 = kj::Array::operator_cast_to_ArrayPtr((Array *)local_100);
    translatedImportPath.ptr = (ReadableDirectory **)AVar11.size_;
    matchedImportDir.ptr = (ImportDir *)AVar11.ptr;
    importPathKey.second = (unsigned_long)matchedImportDir.ptr;
    kj::Maybe<capnp::SchemaParser::DiskFileCompat::ImportDir_&>::Maybe
              ((Maybe<capnp::SchemaParser::DiskFileCompat::ImportDir_&> *)&bestMatchLength);
    __range2 = (ArrayPtr<const_kj::StringPtr> *)0x0;
    __end2 = kj::ArrayPtr<const_kj::StringPtr>::begin(&importPath);
    pSVar6 = kj::ArrayPtr<const_kj::StringPtr>::end(&importPath);
    for (; __end2 != pSVar6; __end2 = __end2 + 1) {
      iter._M_node = (_Base_ptr)(__end2->content).ptr;
      _kjCondition._32_8_ =
           std::
           map<kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
           ::find(&_c208->cachedImportDirs,(key_type *)&iter);
      local_1c0 = (_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>
                   *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                (_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>
                                 *)&_kjCondition.result);
      f.exception = (Exception *)
                    std::
                    map<kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
                    ::end(&_c208->cachedImportDirs);
      kj::_::
      DebugExpression<std::_Rb_tree_iterator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>&>
      ::operator!=((DebugComparison<std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_&,_std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
                    *)local_1b8,
                   (DebugExpression<std::_Rb_tree_iterator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>&>
                    *)&local_1c0,
                   (_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>
                    *)&f);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1b8);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<std::_Rb_tree_iterator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>&,std::_Rb_tree_iterator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>>&>
                  (&local_1d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser.c++"
                   ,0x104,FAILED,"iter != compat->cachedImportDirs.end()","_kjCondition,",
                   (DebugComparison<std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_&,_std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
                    *)local_1b8);
        kj::_::Debug::Fault::fatal(&local_1d0);
      }
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>
                             *)&_kjCondition.result);
      kj::PathPtr::PathPtr((PathPtr *)&_match272,&(ppVar7->second).path);
      bVar1 = kj::Path::startsWith((Path *)local_b8,(PathPtr)__match272);
      if (bVar1) {
        ppVar7 = std::
                 _Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>
                               *)&_kjCondition.result);
        pAVar8 = (ArrayPtr<const_kj::StringPtr> *)kj::Path::size(&(ppVar7->second).path);
        if (__range2 < pAVar8) {
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>
                                 *)&_kjCondition.result);
          __range2 = (ArrayPtr<const_kj::StringPtr> *)kj::Path::size(&(ppVar7->second).path);
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>
                                 *)&_kjCondition.result);
          kj::Maybe<capnp::SchemaParser::DiskFileCompat::ImportDir_&>::operator=
                    ((Maybe<capnp::SchemaParser::DiskFileCompat::ImportDir_&> *)&bestMatchLength,
                     &ppVar7->second);
        }
      }
    }
    match = kj::_::readMaybe<capnp::SchemaParser::DiskFileCompat::ImportDir>
                      ((Maybe<capnp::SchemaParser::DiskFileCompat::ImportDir_&> *)&bestMatchLength);
    if (match != (ImportDir *)0x0) {
      local_1f0 = match;
      path.parts.disposer =
           (ArrayDisposer *)kj::Own::operator_cast_to_ReadableDirectory_((Own *)&match->dir);
      sVar5 = kj::Path::size(&local_1f0->path);
      end = kj::Path::size((Path *)local_b8);
      local_218 = (ArrayPtr<const_kj::String>)kj::Path::slice((Path *)local_b8,sVar5,end);
      kj::PathPtr::clone((PathPtr *)&local_208,(__fn *)&local_218,(void *)local_218.size_,
                         (int)local_218.ptr,__arg);
      kj::Path::operator=((Path *)local_b8,&local_208);
      kj::Path::~Path(&local_208);
    }
  }
  path_00 = path.parts.disposer;
  pPVar9 = kj::mv<kj::Path>((Path *)local_b8);
  kj::Path::Path(&local_240,pPVar9);
  local_258 = importPathKey.second;
  pMStack_250 = (Maybe<kj::String> *)translatedImportPath.ptr;
  kj::str<kj::StringPtr&>(&local_290,(kj *)&diskPath_local.content.size_,params);
  kj::Maybe<kj::String>::Maybe(&local_278,&local_290);
  AVar11.size_ = local_258;
  AVar11.ptr = (ReadableDirectory **)&local_240;
  SchemaFile::newFromDirectory((ReadableDirectory *)&local_228,(Path *)path_00,AVar11,pMStack_250);
  PVar12 = parseFile(this,&local_228);
  kj::Own<capnp::SchemaFile,_std::nullptr_t>::~Own(&local_228);
  kj::Maybe<kj::String>::~Maybe(&local_278);
  kj::String::~String(&local_290);
  kj::Path::~Path(&local_240);
  kj::Path::~Path((Path *)local_b8);
  kj::Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_>::~Locked
            ((Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> *)local_50);
  return PVar12;
}

Assistant:

ParsedSchema SchemaParser::parseDiskFile(
    kj::StringPtr displayName, kj::StringPtr diskPath,
    kj::ArrayPtr<const kj::StringPtr> importPath) const {
  auto lock = impl->compat.lockExclusive();
  DiskFileCompat* compat;
  KJ_IF_SOME(c, *lock) {
    compat = &c;
  } else {
    compat = &lock->emplace();
  }